

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O1

void cppcms::http::context::dispatch
               (intrusive_ptr<cppcms::application> *app,string *url,bool syncronous)

{
  application *paVar1;
  pointer pcVar2;
  response *prVar3;
  context *pcVar4;
  service *psVar5;
  cached_settings *pcVar6;
  session_interface *psVar7;
  undefined7 in_register_00000011;
  long local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  undefined1 *local_68 [2];
  undefined1 local_58 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  if ((int)CONCAT71(in_register_00000011,syncronous) == 0) {
    prVar3 = application::response(app->p_);
    http::response::io_mode(prVar3,asynchronous);
  }
  else {
    prVar3 = application::response(app->p_);
    http::response::io_mode(prVar3,normal);
    pcVar4 = application::context(app->p_);
    psVar5 = cppcms::impl::cgi::connection::service
                       ((pcVar4->conn_).
                        super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    pcVar6 = cppcms::service::cached_settings(psVar5);
    if ((pcVar6->session).disable_automatic_load == false) {
      pcVar4 = application::context(app->p_);
      psVar7 = session(pcVar4);
      session_interface::load(psVar7);
    }
  }
  if (syncronous) {
    pcVar4 = application::context(app->p_);
    psVar5 = cppcms::impl::cgi::connection::service
                       ((pcVar4->conn_).
                        super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    pcVar6 = cppcms::service::cached_settings(psVar5);
    if ((pcVar6->session).disable_automatic_load == false) {
      pcVar4 = application::context(app->p_);
      psVar7 = session(pcVar4);
      session_interface::load(psVar7);
    }
  }
  paVar1 = app->p_;
  pcVar2 = (url->_M_dataplus)._M_p;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar2,pcVar2 + url->_M_string_length);
  (*paVar1->_vptr_application[2])(paVar1,local_68);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  application::get_context(app->p_);
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_88 != 0) {
    if (syncronous) {
      pcVar4 = application::context(app->p_);
      complete_response(pcVar4);
    }
    else {
      pcVar4 = application::context(app->p_);
      async_complete_response(pcVar4);
    }
    application::release_context((application *)(local_58 + 0x20));
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    }
  }
  return;
}

Assistant:

void context::dispatch(booster::intrusive_ptr<application> const &app,std::string const &url,bool syncronous)
{
	try {
		if(syncronous) {
			app->response().io_mode(http::response::normal);
			if(!app->context().service().cached_settings().session.disable_automatic_load)
				app->context().session().load();
		}
		else {
			app->response().io_mode(http::response::asynchronous);
		}

		if(syncronous && !app->context().service().cached_settings().session.disable_automatic_load)
			app->context().session().load();
		app->main(url);
	}
	catch(request_forgery_error const &e) {
		if(app->get_context() && !app->response().some_output_was_written()) {
			app->response().make_error_response(http::response::forbidden);
		}
	}
	catch(...){
		if(app->get_context())
			app->context().translate_exception();
	}
	
	if(app->get_context()) {
		try {
			if(syncronous) {
				app->context().complete_response();
			}
			else  {
				app->context().async_complete_response();
			}
		}
		catch(...) {
			app->release_context();
			throw;
		}
		app->release_context();
	}
}